

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

int ZSTD_disableLiteralsCompression(ZSTD_CCtx_params *cctxParams)

{
  ZSTD_literalCompressionMode_e ZVar1;
  bool local_1d;
  ZSTD_CCtx_params *cctxParams_local;
  
  ZVar1 = cctxParams->literalCompressionMode;
  if (ZVar1 != ZSTD_lcm_auto) {
    if (ZVar1 == ZSTD_lcm_huffman) {
      return 0;
    }
    if (ZVar1 == ZSTD_lcm_uncompressed) {
      return 1;
    }
  }
  local_1d = false;
  if ((cctxParams->cParams).strategy == ZSTD_fast) {
    local_1d = (cctxParams->cParams).targetLength != 0;
  }
  return (uint)local_1d;
}

Assistant:

MEM_STATIC int ZSTD_disableLiteralsCompression(const ZSTD_CCtx_params* cctxParams)
{
    switch (cctxParams->literalCompressionMode) {
    case ZSTD_lcm_huffman:
        return 0;
    case ZSTD_lcm_uncompressed:
        return 1;
    default:
        assert(0 /* impossible: pre-validated */);
        /* fall-through */
    case ZSTD_lcm_auto:
        return (cctxParams->cParams.strategy == ZSTD_fast) && (cctxParams->cParams.targetLength > 0);
    }
}